

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_transfer_metadata(mcpl_file_t source,mcpl_outfile_t target)

{
  double w;
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  uint i_00;
  long lVar5;
  mcpl_fileinternal_t *f_1;
  uint32_t ldata;
  uint32_t i;
  uint32_t local_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  local_38 = 0x1234567;
  if (*(int *)((long)source.internal + 0x38) != 1) {
    pcVar4 = 
    "mcpl_transfer_metadata can only work on files with same endianness as current platform.";
LAB_00102966:
    (*mcpl_error_handler)(pcVar4);
    printf("MCPL ERROR: %s\n",
           "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
    exit(1);
  }
  mcpl_hdr_set_srcname(target,*(char **)((long)source.internal + 0x10));
  if (*(int *)((long)source.internal + 0x48) != 0) {
    i_00 = 0;
    do {
      pcVar4 = mcpl_hdr_comment(source,i_00);
      mcpl_hdr_add_comment(target,pcVar4);
      i_00 = i_00 + 1;
    } while (i_00 < *(uint *)((long)source.internal + 0x48));
  }
  lVar2 = *(long *)((long)source.internal + 0x60);
  if ((lVar2 != 0) && (iVar1 = *(int *)((long)source.internal + 0x58), 0 < (long)iVar1)) {
    lVar5 = 0;
    do {
      pcVar4 = *(char **)(lVar2 + lVar5 * 8);
      iVar3 = mcpl_hdr_blob(source,pcVar4,&local_3c,(char **)&local_38);
      if (iVar3 == 0) {
        pcVar4 = "unexpected key problem in mcpl_transfer_metadata";
        goto LAB_00102966;
      }
      mcpl_hdr_add_data(target,pcVar4,local_3c,(char *)CONCAT44(uStack_34,local_38));
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (*(int *)((long)source.internal + 0x1c) != 0) {
    mcpl_enable_userflags(target);
  }
  if (*(int *)((long)source.internal + 0x20) != 0) {
    mcpl_enable_polarisation(target);
  }
  if (*(int *)((long)source.internal + 0x24) == 0) {
    mcpl_enable_doubleprec(target);
  }
  if (*(int32_t *)((long)source.internal + 0x28) != 0) {
    mcpl_enable_universal_pdgcode(target,*(int32_t *)((long)source.internal + 0x28));
  }
  w = *(double *)((long)source.internal + 0x30);
  if ((w == 0.0) && (!NAN(w))) {
    return;
  }
  mcpl_enable_universal_weight(target,w);
  return;
}

Assistant:

void mcpl_transfer_metadata(mcpl_file_t source, mcpl_outfile_t target)
{
  //Note that MCPL format version 2 and 3 have the same meta-data in the header,
  //except of course the version number itself.

  if (mcpl_hdr_little_endian(source) != mcpl_platform_is_little_endian())
    mcpl_error("mcpl_transfer_metadata can only work on files with same endianness as current platform.");

  mcpl_hdr_set_srcname(target,mcpl_hdr_srcname(source));
  unsigned i;
  for (i = 0; i < mcpl_hdr_ncomments(source); ++i)
    mcpl_hdr_add_comment(target,mcpl_hdr_comment(source,i));
  const char** blobkeys = mcpl_hdr_blobkeys(source);
  if (blobkeys) {
    int nblobs = mcpl_hdr_nblobs(source);
    uint32_t ldata;
    const char * data;
    int ii;
    for (ii = 0; ii < nblobs; ++ii) {
      int res = mcpl_hdr_blob(source,blobkeys[ii],&ldata,&data);
      if (!res)
        mcpl_error("unexpected key problem in mcpl_transfer_metadata");
      (void)res;
      mcpl_hdr_add_data(target, blobkeys[ii], ldata, data);
    }
  }
  if (mcpl_hdr_has_userflags(source))
    mcpl_enable_userflags(target);
  if (mcpl_hdr_has_polarisation(source))
    mcpl_enable_polarisation(target);
  if (mcpl_hdr_has_doubleprec(source))
    mcpl_enable_doubleprec(target);
  int32_t updg = mcpl_hdr_universal_pdgcode(source);
  if (updg)
    mcpl_enable_universal_pdgcode(target,updg);
  double uw = mcpl_hdr_universal_weight(source);
  if (uw)
    mcpl_enable_universal_weight(target,uw);
}